

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O3

bool __thiscall BigInt::operator<(BigInt *this,BigInt *v)

{
  int iVar1;
  int iVar2;
  pointer plVar3;
  pointer plVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  
  iVar1 = this->sign;
  lVar5 = (long)iVar1;
  iVar2 = v->sign;
  if (iVar1 == iVar2) {
    plVar3 = (this->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (long)(this->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)plVar3 >> 3;
    plVar4 = (v->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (long)(v->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)plVar4 >> 3;
    if (uVar7 != uVar6) {
      return uVar7 * lVar5 < uVar6 * lVar5;
    }
    uVar7 = uVar7 & 0xffffffff;
    do {
      uVar7 = uVar7 - 1;
      if ((int)(uint)uVar7 < 0) {
        return false;
      }
      uVar9 = (uint)uVar7 & 0x7fffffff;
      lVar8 = plVar3[uVar9];
      lVar10 = plVar4[uVar9];
    } while (lVar8 == lVar10);
    lVar8 = lVar8 * lVar5;
    lVar10 = lVar10 * lVar5;
    bVar12 = SBORROW8(lVar8,lVar10);
    bVar11 = lVar8 - lVar10 < 0;
  }
  else {
    bVar12 = SBORROW4(iVar1,iVar2);
    bVar11 = iVar1 - iVar2 < 0;
  }
  return bVar12 != bVar11;
}

Assistant:

bool operator<(const BigInt &v) const {
        if (sign != v.sign)//! sign
            return sign < v.sign;
        if (vector_value.size() != v.vector_value.size()) //! size
            return vector_value.size() * sign < v.vector_value.size() * v.sign;
        for (auto i = static_cast<int>(vector_value.size() - 1); i >= 0; i--) //! value
            if (vector_value[i] != v.vector_value[i])
                return vector_value[i] * sign < v.vector_value[i] * sign;
        return false;
    }